

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

bool __thiscall
CoreML::Specification::InnerProductLayerParams::MergePartialFromCodedStream
          (InnerProductLayerParams *this,CodedInputStream *input)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  bool bVar4;
  int length;
  uint uVar5;
  int byte_limit;
  uint32 uVar6;
  unsigned_long uVar7;
  uint8 *puVar8;
  WeightParams *this_00;
  pair<int,_int> pVar9;
  char cVar10;
  ulong uVar11;
  pair<unsigned_long,_bool> pVar12;
  
LAB_002273af:
  pbVar3 = input->buffer_;
  uVar6 = 0;
  if (pbVar3 < input->buffer_end_) {
    bVar2 = *pbVar3;
    uVar11 = (ulong)bVar2;
    pbVar1 = pbVar3 + 1;
    uVar5 = (uint)bVar2;
    if ((char)bVar2 < '\x01') {
      uVar6 = (uint)bVar2;
      if ((input->buffer_end_ <= pbVar1) || (uVar6 = uVar5, (~(uint)*pbVar1 & uVar5) < 0x80))
      goto LAB_00227638;
      uVar11 = (ulong)((uVar5 + (uint)*pbVar1 * 0x80) - 0x80);
      input->buffer_ = pbVar3 + 2;
    }
    else {
      input->buffer_ = pbVar1;
    }
    uVar11 = uVar11 | 0x100000000;
  }
  else {
LAB_00227638:
    uVar6 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar6);
    uVar11 = 0;
    if (uVar6 - 1 < 0x3fff) {
      uVar11 = 0x100000000;
    }
    uVar11 = uVar6 | uVar11;
  }
  uVar6 = (uint32)uVar11;
  if ((uVar11 & 0x100000000) == 0) goto LAB_0022740c;
  uVar5 = (uint)(uVar11 >> 3) & 0x1fffffff;
  cVar10 = (char)uVar11;
  if (uVar5 < 0x14) {
    if (uVar5 == 1) {
      if (cVar10 != '\b') goto LAB_0022740c;
      puVar8 = input->buffer_;
      if ((puVar8 < input->buffer_end_) && (-1 < (long)(char)*puVar8)) {
        this->inputchannels_ = (long)(char)*puVar8;
        goto LAB_00227547;
      }
      pVar12 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
      this->inputchannels_ = pVar12.first;
LAB_0022762d:
      if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        return false;
      }
      goto LAB_002273af;
    }
    if (uVar5 == 2) {
      if (cVar10 == '\x10') {
        puVar8 = input->buffer_;
        if ((input->buffer_end_ <= puVar8) || ((long)(char)*puVar8 < 0)) {
          pVar12 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
          this->outputchannels_ = pVar12.first;
          goto LAB_0022762d;
        }
        this->outputchannels_ = (long)(char)*puVar8;
LAB_00227547:
        input->buffer_ = puVar8 + 1;
        goto LAB_002273af;
      }
    }
    else if ((uVar5 == 10) && (cVar10 == 'P')) {
      puVar8 = input->buffer_;
      if ((puVar8 < input->buffer_end_) && (uVar7 = (unsigned_long)(char)*puVar8, -1 < (long)uVar7))
      {
        input->buffer_ = puVar8 + 1;
      }
      else {
        pVar12 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        uVar7 = pVar12.first;
        if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
      }
      this->hasbias_ = uVar7 != 0;
      goto LAB_002273af;
    }
  }
  else {
    if (uVar5 == 0x14) {
      if (cVar10 != -0x5e) goto LAB_0022740c;
      this_00 = this->weights_;
      if (this_00 == (WeightParams *)0x0) {
        this_00 = (WeightParams *)operator_new(0x50);
        WeightParams::WeightParams(this_00);
        this->weights_ = this_00;
      }
LAB_0022757e:
      puVar8 = input->buffer_;
      if ((puVar8 < input->buffer_end_) && (byte_limit = (int)(char)*puVar8, -1 < byte_limit)) {
        input->buffer_ = puVar8 + 1;
      }
      else {
        byte_limit = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (byte_limit < 0) {
          return false;
        }
      }
      pVar9 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                        (input,byte_limit);
      if ((long)pVar9 < 0) {
        return false;
      }
      bVar4 = WeightParams::MergePartialFromCodedStream(this_00,input);
      if (!bVar4) {
        return false;
      }
      bVar4 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                        (input,pVar9.first);
LAB_0022742c:
      if (bVar4 == false) {
        return false;
      }
      goto LAB_002273af;
    }
    if (uVar5 == 0x15) {
      if (cVar10 == -0x56) {
        this_00 = this->bias_;
        if (this_00 == (WeightParams *)0x0) {
          this_00 = (WeightParams *)operator_new(0x50);
          WeightParams::WeightParams(this_00);
          this->bias_ = this_00;
        }
        goto LAB_0022757e;
      }
      goto LAB_0022740c;
    }
    if ((uVar5 == 0x16) && (cVar10 == -0x50)) {
      puVar8 = input->buffer_;
      if ((puVar8 < input->buffer_end_) && (uVar7 = (unsigned_long)(char)*puVar8, -1 < (long)uVar7))
      {
        input->buffer_ = puVar8 + 1;
      }
      else {
        pVar12 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        uVar7 = pVar12.first;
        if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
      }
      this->int8dynamicquantize_ = uVar7 != 0;
      goto LAB_002273af;
    }
  }
LAB_0022740c:
  if (uVar6 == 0) {
    return true;
  }
  if ((uVar6 & 7) == 4) {
    return true;
  }
  bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar6);
  goto LAB_0022742c;
}

Assistant:

bool InnerProductLayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.InnerProductLayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // uint64 inputChannels = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &inputchannels_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // uint64 outputChannels = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &outputchannels_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool hasBias = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(80u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &hasbias_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams weights = 20;
      case 20: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(162u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_weights()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams bias = 21;
      case 21: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(170u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_bias()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool int8DynamicQuantize = 22;
      case 22: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(176u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &int8dynamicquantize_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.InnerProductLayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.InnerProductLayerParams)
  return false;
#undef DO_
}